

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O2

hFILE * hdopen(int fd,char *mode)

{
  size_t capacity;
  hFILE *phVar1;
  char *pcVar2;
  
  capacity = blksize(fd);
  phVar1 = hfile_init(0x40,mode,capacity);
  if (phVar1 != (hFILE *)0x0) {
    *(int *)&phVar1[1].buffer = fd;
    pcVar2 = strchr(mode,0x73);
    *(byte *)((long)&phVar1[1].buffer + 4) =
         *(byte *)((long)&phVar1[1].buffer + 4) & 0xfe | pcVar2 != (char *)0x0;
    phVar1->backend = &fd_backend;
  }
  return phVar1;
}

Assistant:

hFILE *hdopen(int fd, const char *mode)
{
    hFILE_fd *fp = (hFILE_fd*) hfile_init(sizeof (hFILE_fd), mode, blksize(fd));
    if (fp == NULL) return NULL;

    fp->fd = fd;
    fp->is_socket = (strchr(mode, 's') != NULL);
    fp->base.backend = &fd_backend;
    return &fp->base;
}